

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttf.c
# Opt level: O3

int ttf_font_ascent(ALLEGRO_FONT *f)

{
  return (int)(*(ulong *)(*(long *)(*f->data + 0xa0) + 0x30) >> 6);
}

Assistant:

static int ttf_font_ascent(ALLEGRO_FONT const *f)
{
    ALLEGRO_TTF_FONT_DATA *data;
    FT_Face face;

    ASSERT(f);

    data = f->data;
    face = data->face;

    return face->size->metrics.ascender >> 6;
}